

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

char * cmSHA224_End(SHA_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_44;
  sha_byte **ppsStack_40;
  int i;
  sha_byte *d;
  sha_byte digest [28];
  char *buffer_local;
  SHA_CTX *context_local;
  
  ppsStack_40 = &d;
  unique0x100000c2 = buffer;
  if (context != (SHA_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      memset(context,0,0xd0);
    }
    else {
      cmSHA224_Final((sha_byte *)&d,context);
      for (local_44 = 0; local_44 < 0x1c; local_44 = local_44 + 1) {
        pcVar1 = stack0xffffffffffffffe8 + 1;
        *stack0xffffffffffffffe8 = sha_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf0) >> 4];
        register0x00000010 = stack0xffffffffffffffe8 + 2;
        *pcVar1 = sha_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf)];
        ppsStack_40 = (sha_byte **)((long)ppsStack_40 + 1);
      }
      *stack0xffffffffffffffe8 = '\0';
    }
    memset(&d,0,0x1c);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                ,0x49e,"char *cmSHA224_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA224_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA224_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA224_Final(digest, context);

		for (i = 0; i < SHA224_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA224_DIGEST_LENGTH);
	return buffer;
}